

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_image.c
# Opt level: O0

HPDF_STATUS HPDF_Image_SetMask(HPDF_Image image,HPDF_BOOL mask)

{
  HPDF_BOOL HVar1;
  HPDF_UINT HVar2;
  HPDF_STATUS HVar3;
  HPDF_STATUS ret;
  HPDF_Boolean image_mask;
  HPDF_BOOL mask_local;
  HPDF_Image image_local;
  
  HVar1 = HPDF_Image_Validate(image);
  if (HVar1 == 0) {
    image_local = (HPDF_Image)0x1030;
  }
  else if ((mask == 0) || (HVar2 = HPDF_Image_GetBitsPerComponent(image), HVar2 == 1)) {
    ret = (HPDF_STATUS)HPDF_Dict_GetItem(image,"ImageMask",3);
    if ((void *)ret == (void *)0x0) {
      ret = (HPDF_STATUS)HPDF_Boolean_New(image->mmgr,0);
      HVar3 = HPDF_Dict_Add(image,"ImageMask",(void *)ret);
      if (HVar3 != 0) {
        return HVar3;
      }
    }
    *(HPDF_BOOL *)(ret + 8) = mask;
    image_local = (HPDF_Image)0x0;
  }
  else {
    image_local = (HPDF_Image)HPDF_SetError(image->error,0x101e,0);
  }
  return (HPDF_STATUS)image_local;
}

Assistant:

HPDF_STATUS
HPDF_Image_SetMask (HPDF_Image   image,
                    HPDF_BOOL    mask)
{
    HPDF_Boolean image_mask;

    if (!HPDF_Image_Validate (image))
        return HPDF_INVALID_IMAGE;

    if (mask && HPDF_Image_GetBitsPerComponent (image) != 1)
        return HPDF_SetError (image->error, HPDF_INVALID_BIT_PER_COMPONENT,
                0);

    image_mask = HPDF_Dict_GetItem (image, "ImageMask", HPDF_OCLASS_BOOLEAN);
    if (!image_mask) {
        HPDF_STATUS ret;
        image_mask = HPDF_Boolean_New (image->mmgr, HPDF_FALSE);

        if ((ret = HPDF_Dict_Add (image, "ImageMask", image_mask)) != HPDF_OK)
            return ret;
    }

    image_mask->value = mask;
    return HPDF_OK;
}